

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O3

bool S2LatLngRect::IntersectsLatEdge(S2Point *a,S2Point *b,double lat,S1Interval *lng)

{
  bool bVar1;
  double dVar2;
  undefined4 uVar3;
  uint uVar4;
  S1Interval SVar5;
  S1Interval ab_theta;
  Vector3_d local_d8;
  double local_c0;
  double local_b8;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  S2Point local_88;
  double local_68;
  S2Point local_58;
  double local_40;
  double local_38;
  double dStack_30;
  
  local_b8 = lat;
  bVar1 = S2::IsUnitLength(a);
  if (bVar1) {
    bVar1 = S2::IsUnitLength(b);
    if (bVar1) {
      S2::RobustCrossProd(&local_d8,a,b);
      dVar2 = SQRT(local_d8.c_[1] * local_d8.c_[1] + local_d8.c_[0] * local_d8.c_[0] +
                   local_d8.c_[2] * local_d8.c_[2]);
      dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                      (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
      uVar3 = SUB84(dVar2 * local_d8.c_[1],0);
      uVar4 = (uint)((ulong)(dVar2 * local_d8.c_[1]) >> 0x20);
      local_88.c_[2] = dVar2 * local_d8.c_[2];
      local_88.c_[1]._0_4_ = uVar3;
      local_88.c_[0] = dVar2 * local_d8.c_[0];
      local_88.c_[1]._4_4_ = uVar4;
      if (local_88.c_[2] < 0.0) {
        local_88.c_[2] = -local_88.c_[2];
        local_88.c_[0] = -(dVar2 * local_d8.c_[0]);
        local_88.c_[1]._4_4_ = uVar4 ^ 0x80000000;
      }
      local_58.c_[0] = 0.0;
      local_58.c_[1] = 0.0;
      local_58.c_[2] = 1.0;
      S2::RobustCrossProd(&local_d8,&local_88,&local_58);
      dVar2 = SQRT(local_d8.c_[2] * local_d8.c_[2] +
                   local_d8.c_[0] * local_d8.c_[0] + local_d8.c_[1] * local_d8.c_[1]);
      dStack_90 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                          (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
      local_a8 = dStack_90 * local_d8.c_[0];
      local_98 = dStack_90 * local_d8.c_[1];
      dStack_90 = dStack_90 * local_d8.c_[2];
      local_d8.c_[0] = local_88.c_[2] * local_98 - dStack_90 * local_88.c_[1];
      local_d8.c_[1] = local_88.c_[0] * dStack_90 - local_a8 * local_88.c_[2];
      uStack_a0 = 0;
      local_d8.c_[2] = local_88.c_[1] * local_a8 - local_88.c_[0] * local_98;
      bVar1 = S2::IsUnitLength(&local_d8);
      if (bVar1) {
        if (0.0 <= local_d8.c_[2]) {
          local_68 = sin(local_b8);
          if (ABS(local_68) < local_d8.c_[2]) {
            if (local_d8.c_[2] <= 0.0) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&local_58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                         ,0x19a,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_58.c_[1],"Check failed: (x[2]) > (0) ",0x1b);
              goto LAB_001f4a04;
            }
            local_68 = local_68 / local_d8.c_[2];
            local_c0 = 1.0 - local_68 * local_68;
            if (local_c0 < 0.0) {
              local_c0 = sqrt(local_c0);
            }
            else {
              local_c0 = SQRT(local_c0);
            }
            local_b8 = atan2(local_c0,local_68);
            local_38 = dStack_90;
            dStack_30 = dStack_90;
            local_40 = atan2(dStack_90 * a->c_[2] + local_98 * a->c_[1] + local_a8 * a->c_[0] + 0.0,
                             a->c_[2] * local_d8.c_[2] +
                             a->c_[1] * local_d8.c_[1] + a->c_[0] * local_d8.c_[0] + 0.0);
            dVar2 = atan2(local_38 * b->c_[2] + local_98 * b->c_[1] + local_a8 * b->c_[0] + 0.0,
                          b->c_[2] * local_d8.c_[2] +
                          b->c_[1] * local_d8.c_[1] + b->c_[0] * local_d8.c_[0] + 0.0);
            SVar5 = S1Interval::FromPointPair(local_40,dVar2);
            local_58.c_[0] = SVar5.bounds_.c_[0];
            local_58.c_[1] = SVar5.bounds_.c_[1];
            bVar1 = S1Interval::Contains((S1Interval *)&local_58,local_b8);
            if (bVar1) {
              dVar2 = atan2(local_98 * local_c0 + local_d8.c_[1] * local_68,
                            local_a8 * local_c0 + local_d8.c_[0] * local_68);
              bVar1 = S1Interval::Contains(lng,dVar2);
              if (bVar1) {
                return true;
              }
            }
            bVar1 = S1Interval::Contains((S1Interval *)&local_58,-local_b8);
            if (bVar1) {
              dVar2 = atan2(local_68 * local_d8.c_[1] - local_c0 * local_98,
                            local_d8.c_[0] * local_68 - local_a8 * local_c0);
              bVar1 = S1Interval::Contains(lng,dVar2);
              if (bVar1) {
                return true;
              }
            }
          }
          return false;
        }
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                   ,0x192,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_58.c_[1],"Check failed: (x[2]) >= (0) ",0x1c);
      }
      else {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                   ,0x191,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_58.c_[1],"Check failed: S2::IsUnitLength(x) ",0x22);
      }
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                 ,0x187,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_88.c_[1],"Check failed: S2::IsUnitLength(b) ",0x22);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x186,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_88.c_[1],"Check failed: S2::IsUnitLength(a) ",0x22);
  }
LAB_001f4a04:
  abort();
}

Assistant:

bool S2LatLngRect::IntersectsLatEdge(const S2Point& a, const S2Point& b,
                                     double lat, const S1Interval& lng) {
  // Return true if the segment AB intersects the given edge of constant
  // latitude.  Unfortunately, lines of constant latitude are curves on
  // the sphere.  They can intersect a straight edge in 0, 1, or 2 points.
  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // First, compute the normal to the plane AB that points vaguely north.
  Vector3_d z = S2::RobustCrossProd(a, b).Normalize();
  if (z[2] < 0) z = -z;

  // Extend this to an orthonormal frame (x,y,z) where x is the direction
  // where the great circle through AB achieves its maximium latitude.
  Vector3_d y = S2::RobustCrossProd(z, S2Point(0, 0, 1)).Normalize();
  Vector3_d x = y.CrossProd(z);
  S2_DCHECK(S2::IsUnitLength(x));
  S2_DCHECK_GE(x[2], 0);

  // Compute the angle "theta" from the x-axis (in the x-y plane defined
  // above) where the great circle intersects the given line of latitude.
  double sin_lat = sin(lat);
  if (fabs(sin_lat) >= x[2]) {
    return false;  // The great circle does not reach the given latitude.
  }
  S2_DCHECK_GT(x[2], 0);
  double cos_theta = sin_lat / x[2];
  double sin_theta = sqrt(1 - cos_theta * cos_theta);
  double theta = atan2(sin_theta, cos_theta);

  // The candidate intersection points are located +/- theta in the x-y
  // plane.  For an intersection to be valid, we need to check that the
  // intersection point is contained in the interior of the edge AB and
  // also that it is contained within the given longitude interval "lng".

  // Compute the range of theta values spanned by the edge AB.
  S1Interval ab_theta = S1Interval::FromPointPair(
      atan2(a.DotProd(y), a.DotProd(x)),
      atan2(b.DotProd(y), b.DotProd(x)));

  if (ab_theta.Contains(theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta + y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  if (ab_theta.Contains(-theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta - y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  return false;
}